

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialize.h
# Opt level: O0

Writer * __thiscall chatra::Writer::outPointer<chatra::Lock>(Writer *this,Lock *value)

{
  mapped_type *pmVar1;
  Writer *pWVar2;
  Lock *local_20;
  Lock *local_18;
  Lock *value_local;
  Writer *this_local;
  
  local_20 = value;
  local_18 = value;
  value_local = (Lock *)this;
  pmVar1 = std::
           unordered_map<const_void_*,_unsigned_long,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
           ::at(&this->pointerMap,&local_20);
  pWVar2 = out<unsigned_long,_nullptr>(this,*pmVar1);
  return pWVar2;
}

Assistant:

Writer& outPointer(const Type* value) {
		CHATRA_SAVE_TYPE_TAG(Pointer);
		chatra_assert(pointerMap.count(value) != 0);
		return out(pointerMap.at(value));
	}